

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[42],kj::_::DebugComparison<wchar_t&,wchar_t_const&>&,unsigned_long&,kj::CappedArray<char,9ul>,kj::CappedArray<char,9ul>>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [42],
               DebugComparison<wchar_t_&,_const_wchar_t_&> *params_1,unsigned_long *params_2,
               CappedArray<char,_9UL> *params_3,CappedArray<char,_9UL> *params_4)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  long lVar5;
  String *result;
  undefined4 in_stack_ffffffffffffff28;
  String local_c8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  String local_98;
  String local_80;
  String local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  str<char_const(&)[42]>
            (&local_c8,(kj *)params,(char (*) [42])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_48,params_1);
  local_b0 = local_48;
  local_a8 = local_40;
  uStack_a0 = uStack_38;
  str<unsigned_long&>(&local_98,(kj *)params_2,params_00);
  sVar1 = params_3->currentSize;
  heapString(&local_80,sVar1);
  if (sVar1 != 0) {
    if ((char *)local_80.content.size_ != (char *)0x0) {
      local_80.content.size_ = (size_t)local_80.content.ptr;
    }
    memcpy((void *)local_80.content.size_,params_3->content,sVar1);
  }
  sVar1 = params_4->currentSize;
  heapString(&local_68,sVar1);
  if (sVar1 != 0) {
    if ((char *)local_68.content.size_ != (char *)0x0) {
      local_68.content.size_ = (size_t)local_68.content.ptr;
    }
    memcpy((void *)local_68.content.size_,params_4->content,sVar1);
  }
  argValues.ptr._4_4_ = severity;
  argValues.ptr._0_4_ = in_stack_ffffffffffffff28;
  argValues.size_ = (size_t)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_c8,argValues);
  lVar5 = 0x60;
  do {
    lVar2 = *(long *)((long)&local_c8.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_c8.content.size_ + lVar5);
      *(undefined8 *)((long)&local_c8.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_c8.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_c8.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}